

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegexPattern.cpp
# Opt level: O1

RegexPattern *
UnifiedRegex::RegexPattern::New(ScriptContext *scriptContext,Program *program,bool isLiteral)

{
  Recycler *alloc;
  RegexPattern *this;
  undefined1 local_50 [8];
  TrackAllocData data;
  
  local_50 = (undefined1  [8])&typeinfo;
  data.typeinfo = (type_info *)0x0;
  data.plusSize = 0xffffffffffffffff;
  data.count = (size_t)anon_var_dwarf_a85219e;
  data.filename._0_4_ = 0x19;
  alloc = Memory::Recycler::TrackAllocInfo(scriptContext->recycler,(TrackAllocData *)local_50);
  this = (RegexPattern *)new<Memory::Recycler>(0x38,alloc,0x3a2aea);
  RegexPattern(this,(scriptContext->super_ScriptContextBase).javascriptLibrary,program,isLiteral);
  return this;
}

Assistant:

RegexPattern *RegexPattern::New(Js::ScriptContext *scriptContext, Program* program, bool isLiteral)
    {
        return
            RecyclerNewFinalized(
                scriptContext->GetRecycler(),
                RegexPattern,
                scriptContext->GetLibrary(),
                program,
                isLiteral);
    }